

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O0

void device_fini(void *arg)

{
  int local_20;
  int local_1c;
  int i_1;
  int i;
  device_data *d;
  void *arg_local;
  
  for (local_1c = 0; local_1c < *(int *)((long)arg + 8); local_1c = local_1c + 1) {
    nni_aio_stop((nni_aio *)((long)arg + (long)local_1c * 0x1e8 + 0x38));
  }
  for (local_20 = 0; local_20 < *(int *)((long)arg + 8); local_20 = local_20 + 1) {
    nni_aio_fini((nni_aio *)((long)arg + (long)local_20 * 0x1e8 + 0x38));
  }
  nni_sock_rele(*(nni_sock **)((long)arg + 0x28));
  nni_sock_rele(*(nni_sock **)((long)arg + 0x30));
  nni_free(arg,0x3f0);
  return;
}

Assistant:

static void
device_fini(void *arg)
{
	device_data *d = arg;

	for (int i = 0; i < d->num_paths; i++) {
		nni_aio_stop(&d->paths[i].aio);
	}
	for (int i = 0; i < d->num_paths; i++) {
		nni_aio_fini(&d->paths[i].aio);
	}
	nni_sock_rele(d->paths[0].src);
	nni_sock_rele(d->paths[0].dst);
	NNI_FREE_STRUCT(d);
}